

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O3

void Omega_h::vtk::describe_array<int>(ostream *stream,string *name,Int ncomps)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"type=\"",6);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"Int32",5);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(stream," Name=\"",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(stream," NumberOfComponents=\"",0x15);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)stream,ncomps);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(stream," format=\"binary\"",0x10);
  return;
}

Assistant:

void describe_array(std::ostream& stream, std::string const& name, Int ncomps) {
  stream << "type=\"" << Traits<T>::name() << "\"";
  stream << " Name=\"" << name << "\"";
  stream << " NumberOfComponents=\"" << ncomps << "\"";
  stream << " format=\"binary\"";
}